

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O3

void dirSAVETAP(void)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  uint param3;
  undefined8 in_RCX;
  undefined8 uVar6;
  EStatus type;
  uint start;
  uint param2;
  char *pcVar7;
  aint val;
  char *id;
  string fnaamh;
  path fnaam;
  uint local_b0;
  undefined4 local_ac;
  uint local_a8;
  uint local_a4;
  char *local_a0;
  long *local_98;
  long local_90;
  long local_88 [2];
  string local_78;
  path local_58;
  
  pcVar1 = DeviceID;
  if (pass != 3) {
    SkipParam(&lp);
    return;
  }
  if (DeviceID == (char *)0x0) {
    Error("SAVETAP only allowed in real device emulation mode (See DEVICE)",(char *)0x0,PASS3);
  }
  GetOutputFileName_abi_cxx11_(&local_58,&lp);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  bVar2 = anyComma(&lp);
  if (bVar2) {
    bVar2 = anyComma(&lp);
    pcVar7 = lp;
    if (bVar2) {
LAB_0010edaa:
      Error("[SAVETAP] Syntax error. No parameters",bp,PASS3);
      goto LAB_0010f1ce;
    }
    local_a0 = GetID(&lp);
    uVar6 = CONCAT71((int7)((ulong)in_RCX >> 8),0xff);
    local_ac = (undefined4)uVar6;
    if ((local_a0 == (char *)0x0) || (*local_a0 == '\0')) {
LAB_0010f135:
      IsLabelNotFound = false;
      lp = pcVar7;
      iVar4 = ParseExpression(&lp,(aint *)&local_b0);
      type = PASS3;
      pcVar7 = "[SAVETAP] Syntax error";
      if ((iVar4 != 0) && (IsLabelNotFound == false)) {
        if (-1 < (int)local_b0) {
          local_a8 = 0xffffffff;
          bVar2 = false;
          param2 = 0xffffffff;
          param3 = 0xffffffff;
          start = local_b0;
          goto LAB_0010f183;
        }
LAB_0010f1b3:
        type = PASS3;
        pcVar7 = "[SAVETAP] Negative values are not allowed";
      }
    }
    else {
      iVar4 = cmphstr(&local_a0,"basic",false);
      local_ac = 0;
      bVar2 = false;
      if (iVar4 == 0) {
        iVar4 = cmphstr(&local_a0,"numbers",false);
        if (iVar4 == 0) {
          iVar4 = cmphstr(&local_a0,"chars",false);
          if (iVar4 == 0) {
            iVar4 = cmphstr(&local_a0,"code",false);
            if (iVar4 == 0) {
              iVar4 = cmphstr(&local_a0,"headless",false);
              bVar2 = true;
              local_ac = (undefined4)CONCAT71((int7)((ulong)uVar6 >> 8),0xff);
              if (iVar4 == 0) goto LAB_0010f135;
              goto LAB_0010ee46;
            }
            local_ac = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),3);
          }
          else {
            local_ac = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),2);
          }
        }
        else {
          local_ac = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),1);
        }
        bVar2 = false;
      }
LAB_0010ee46:
      bVar3 = anyComma(&lp);
      if (!bVar3) goto LAB_0010f135;
      if (bVar2) {
        bVar2 = anyComma(&lp);
        type = PASS3;
        if (bVar2) {
          pcVar7 = "[SAVETAP] Syntax error. Missing start address";
          goto LAB_0010f1ba;
        }
        iVar4 = ParseExpression(&lp,(aint *)&local_b0);
        start = local_b0;
        pcVar7 = "[SAVETAP] Syntax error";
        if (iVar4 == 0) goto LAB_0010f1ba;
        pcVar5 = "[SAVETAP] Negative values are not allowed";
        if (((int)local_b0 < 0) ||
           (pcVar5 = "[SAVETAP] Values higher than FFFFh are not allowed", 0xffff < local_b0)) {
LAB_0010eee3:
          type = PASS3;
          pcVar7 = pcVar5;
          goto LAB_0010f1ba;
        }
        bVar2 = anyComma(&lp);
        local_a8 = 0xffffffff;
        if (bVar2) {
          iVar4 = ParseExpression(&lp,(aint *)&local_b0);
          if (iVar4 == 0) goto LAB_0010f1ba;
          if (-1 < (int)local_b0) {
            local_a8 = local_b0;
            if (0xffff < local_b0) goto LAB_0010f105;
            goto LAB_0010f201;
          }
          goto LAB_0010f1b3;
        }
LAB_0010f201:
        bVar2 = anyComma(&lp);
        if (bVar2) {
          iVar4 = ParseExpression(&lp,(aint *)&local_b0);
          if (iVar4 != 0) {
            bVar2 = true;
            param3 = local_b0;
            param2 = 0xffffffff;
            if (local_b0 < 0x100) goto LAB_0010f183;
            pcVar7 = "[SAVETAP] Invalid flag byte";
          }
          goto LAB_0010f1ba;
        }
        param2 = 0xffffffff;
LAB_0010f255:
        bVar2 = true;
        param3 = 0xffffffff;
LAB_0010f183:
        if (pcVar1 == (char *)0x0) goto LAB_0010f1ce;
        if (!bVar2) goto LAB_0010ed87;
        iVar4 = TAP_SaveBlock(&local_58,(uchar)local_ac,(char *)local_98,start,local_a8,param2,
                              param3);
        goto LAB_0010eda0;
      }
      bVar2 = anyComma(&lp);
      type = PASS3;
      if (bVar2) {
        pcVar7 = "[SAVETAP] Syntax error. Missing tape block file name";
      }
      else {
        GetDelimitedString_abi_cxx11_(&local_78,&lp);
        std::__cxx11::string::operator=((string *)&local_98,(string *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if (local_90 == 0) {
          pcVar7 = "[SAVETAP] Syntax error in tape file name";
        }
        else {
          bVar2 = anyComma(&lp);
          pcVar7 = "[SAVETAP] Syntax error. Missing start address";
          if ((((bVar2) && (bVar2 = anyComma(&lp), !bVar2)) &&
              (iVar4 = ParseExpression(&lp,(aint *)&local_b0), start = local_b0, iVar4 != 0)) &&
             (pcVar7 = "[SAVETAP] Negative values are not allowed", -1 < (int)local_b0)) {
            pcVar5 = "[SAVETAP] Values higher than FFFFh are not allowed";
            if (0xffff < local_b0) goto LAB_0010eee3;
            bVar2 = anyComma(&lp);
            if (((!bVar2) || (bVar2 = anyComma(&lp), bVar2)) ||
               (iVar4 = ParseExpression(&lp,(aint *)&local_b0), iVar4 == 0)) {
              pcVar7 = "[SAVETAP] Syntax error. Missing block length";
            }
            else {
              local_a8 = local_b0;
              if (-1 < (int)local_b0) {
                if (local_b0 < 0x10000) {
                  bVar2 = anyComma(&lp);
                  local_a4 = 0xffffffff;
                  if (!bVar2) {
LAB_0010f04c:
                    bVar2 = anyComma(&lp);
                    param2 = local_a4;
                    if (bVar2) {
                      iVar4 = ParseExpression(&lp,(aint *)&local_b0);
                      if (iVar4 == 0) goto LAB_0010f268;
                      if ((int)local_b0 < 0) goto LAB_0010f1ba;
                      bVar2 = true;
                      param3 = local_b0;
                      param2 = local_a4;
                      if (0xffff < local_b0) goto LAB_0010f09d;
                      goto LAB_0010f183;
                    }
                    goto LAB_0010f255;
                  }
                  iVar4 = ParseExpression(&lp,(aint *)&local_b0);
                  if (iVar4 == 0) {
LAB_0010f268:
                    type = IF_FIRST;
                    pcVar7 = "[SAVETAP] Syntax error";
                  }
                  else {
                    local_a4 = local_b0;
                    if (-1 < (int)local_b0) {
                      if (local_b0 < 0x10000) goto LAB_0010f04c;
LAB_0010f09d:
                      pcVar7 = "[SAVETAP] Values more than FFFFh are not allowed";
                    }
                  }
                }
                else {
LAB_0010f105:
                  type = PASS3;
                  pcVar7 = "[SAVETAP] Values higher than FFFFh are not allowed";
                }
              }
            }
          }
        }
      }
    }
LAB_0010f1ba:
    Error(pcVar7,bp,type);
  }
  else {
    if (StartAddress < 0) goto LAB_0010edaa;
    start = StartAddress;
    if (pcVar1 == (char *)0x0) goto LAB_0010f1ce;
LAB_0010ed87:
    bVar2 = IsZXSpectrumDevice(DeviceID);
    if (bVar2) {
      iVar4 = TAP_SaveSnapshot(&local_58,(unsigned_short)start);
LAB_0010eda0:
      if (iVar4 != 0) goto LAB_0010f1ce;
    }
    else {
      Error("[SAVETAP snapshot] Device is not of ZX Spectrum type.",Device->ID,SUPPRESS);
    }
    Error("[SAVETAP] Error writing file",bp,IF_FIRST);
  }
LAB_0010f1ce:
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_58);
  return;
}

Assistant:

static void dirSAVETAP() {
	if (pass != LASTPASS) {
		SkipParam(lp);
		return;
	}

	bool exec = true, realtapeMode = false;
	int headerType = -1;
	aint val;
	int start = -1, length = -1, param2 = -1, param3 = -1;

	if (!DeviceID) {
		Error("SAVETAP only allowed in real device emulation mode (See DEVICE)");
		exec = false;
	}

	const std::filesystem::path fnaam = GetOutputFileName(lp);
	std::string fnaamh {""};
	if (anyComma(lp)) {
		if (!anyComma(lp)) {
			char *tlp = lp;
			char *id;

			if ((id = GetID(lp)) && strlen(id) > 0) {
				if (cmphstr(id, "basic")) {
					headerType = BASIC;
					realtapeMode = true;
				} else if (cmphstr(id, "numbers")) {
					headerType = NUMBERS;
					realtapeMode = true;
				} else if (cmphstr(id, "chars")) {
					headerType = CHARS;
					realtapeMode = true;
				} else if (cmphstr(id, "code")) {
					headerType = CODE;
					realtapeMode = true;
				} else if (cmphstr(id, "headless")) {
					headerType = HEADLESS;
					realtapeMode = true;
				}
			}

			if (realtapeMode) {
				if (anyComma(lp)) {
					if (headerType == HEADLESS) {
						if (!anyComma(lp)) {
							if (!ParseExpression(lp, val)) {
								Error("[SAVETAP] Syntax error", bp, PASS3); return;
							}
							if (val < 0) {
								Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
							} else if (val > 0xFFFF) {
								Error("[SAVETAP] Values higher than FFFFh are not allowed", bp, PASS3); return;
							}
							start = val;
						} else {
							Error("[SAVETAP] Syntax error. Missing start address", bp, PASS3); return;
						}
						if (anyComma(lp)) {
							if (!ParseExpression(lp, val)) {
								Error("[SAVETAP] Syntax error", bp, PASS3); return;
							}
							if (val < 0) {
								Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
							} else if (val > 0xFFFF) {
								Error("[SAVETAP] Values higher than FFFFh are not allowed", bp, PASS3); return;
							}
							length = val;
						}
						if (anyComma(lp)) {
							if (!ParseExpression(lp, val)) {
								Error("[SAVETAP] Syntax error", bp, PASS3); return;
							}
							if (val < 0 || val > 255) {
								Error("[SAVETAP] Invalid flag byte", bp, PASS3); return;
							}
							param3 = val;
						}
					} else if (!anyComma(lp)) {
						fnaamh = GetDelimitedString(lp);
						if (fnaamh.empty()) {
							Error("[SAVETAP] Syntax error in tape file name", bp, PASS3);
							return;
						} else if (anyComma(lp) && !anyComma(lp) && ParseExpression(lp, val)) {
							if (val < 0) {
								Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
							} else if (val > 0xFFFF) {
								Error("[SAVETAP] Values higher than FFFFh are not allowed", bp, PASS3); return;
							}
							start = val;

							if (anyComma(lp) && !anyComma(lp) && ParseExpression(lp, val)) {
								if (val < 0) {
									Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
								} else if (val > 0xFFFF) {
									Error("[SAVETAP] Values higher than FFFFh are not allowed", bp, PASS3); return;
								}
								length = val;

								if (anyComma(lp)) {
									if (!ParseExpression(lp, val)) {
										Error("[SAVETAP] Syntax error", bp, IF_FIRST); return;
									}
									if (val < 0) {
										Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
									} else if (val > 0xFFFF) {
										Error("[SAVETAP] Values more than FFFFh are not allowed", bp, PASS3); return;
									}
									param2 = val;
								}
								if (anyComma(lp)) {
									if (!ParseExpression(lp, val)) {
										Error("[SAVETAP] Syntax error", bp, IF_FIRST); return;
									}
									if (val < 0) {
										Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
									} else if (val > 0xFFFF) {
										Error("[SAVETAP] Values more than FFFFh are not allowed", bp, PASS3); return;
									}
									param3 = val;
								}
							} else {
								Error("[SAVETAP] Syntax error. Missing block length", bp, PASS3); return;
							}
						} else {
							Error("[SAVETAP] Syntax error. Missing start address", bp, PASS3); return;
						}
					} else {
						Error("[SAVETAP] Syntax error. Missing tape block file name", bp, PASS3); return;
					}
				} else {
					realtapeMode = false;
				}
			}
			if (!realtapeMode) {
				lp = tlp;
				IsLabelNotFound = false;
				if (!ParseExpression(lp, val) || IsLabelNotFound) {
					Error("[SAVETAP] Syntax error", bp, PASS3); return;
				}
				if (val < 0) {
					Error("[SAVETAP] Negative values are not allowed", bp, PASS3); return;
				}
				start = val;
			}
		} else {
			Error("[SAVETAP] Syntax error. No parameters", bp, PASS3); return;
		}
	} else if (StartAddress < 0) {
		Error("[SAVETAP] Syntax error. No parameters", bp, PASS3); return;
	} else {
		start = StartAddress;
	}

	if (exec) {
		int done = 0;

		if (realtapeMode) {
			done = TAP_SaveBlock(fnaam, headerType, fnaamh.c_str(), start, length, param2, param3);
		} else {
			if (!IsZXSpectrumDevice(DeviceID)) {
				Error("[SAVETAP snapshot] Device is not of ZX Spectrum type.", Device->ID, SUPPRESS);
			} else {
				done = TAP_SaveSnapshot(fnaam, start);
			}
		}

		if (!done) {
			Error("[SAVETAP] Error writing file", bp, IF_FIRST);
		}
	}
}